

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_light.cpp
# Opt level: O0

void * QuadLight_create(void)

{
  Vec3fa *position;
  QuadLight *self;
  size_t in_stack_fffffffffffffed8;
  size_t in_stack_fffffffffffffee0;
  Vec3fa *in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff28;
  
  position = (Vec3fa *)
             embree::alignedUSMMalloc(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,DEFAULT);
  embree::Light_Constructor((Light *)position);
  (position->field_0).m128[0] = 8.40779e-45;
  QuadLight_set((void *)(ulong)in_stack_ffffffffffffff28,position,in_stack_ffffffffffffff18,
                (Vec3fa *)0x0,(Vec3fa *)0x0);
  return position;
}

Assistant:

void* QuadLight_create()
{
  QuadLight* self = (QuadLight*) alignedUSMMalloc(sizeof(QuadLight),16);

  Light_Constructor(&self->super);
  //self->super.sample = GET_FUNCTION_POINTER(QuadLight_sample);
  self->super.type = LIGHT_QUAD;

  QuadLight_set(self,
                Vec3fa(0.f),
                Vec3fa(1.f, 0.f, 0.f),
                Vec3fa(0.f, 1.f, 0.f),
                Vec3fa(1.f));

  return self;
}